

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capi.c
# Opt level: O0

void NGA_Access_block_grid(int g_a,int *index,void *ptr,int *ld)

{
  long in_RCX;
  long in_RSI;
  int in_EDI;
  int i_1;
  int i;
  Integer _ga_lo [7];
  Integer _ga_work [7];
  Integer ndim;
  Integer a;
  Integer in_stack_00000140;
  Integer *in_stack_000003a8;
  void *in_stack_000003b0;
  Integer *in_stack_000003b8;
  Integer in_stack_000003c0;
  int local_b0;
  int local_ac;
  long local_68 [7];
  long local_30;
  long local_28;
  long local_20;
  long local_10;
  
  local_28 = (long)in_EDI;
  local_20 = in_RCX;
  local_10 = in_RSI;
  local_30 = pnga_ndim(in_stack_00000140);
  for (local_ac = 0; local_ac < local_30; local_ac = local_ac + 1) {
    local_68[(local_30 - local_ac) + -9] = (long)*(int *)(local_10 + (long)local_ac * 4);
  }
  pnga_access_block_grid_ptr
            (in_stack_000003c0,in_stack_000003b8,in_stack_000003b0,in_stack_000003a8);
  for (local_b0 = 0; (long)local_b0 < local_30 + -1; local_b0 = local_b0 + 1) {
    *(int *)(local_20 + ((local_30 - local_b0) + -2) * 4) = (int)local_68[local_b0];
  }
  return;
}

Assistant:

void NGA_Access_block_grid(int g_a, int index[], void *ptr, int ld[])
{
     Integer a=(Integer)g_a;
     Integer ndim = wnga_ndim(a);
     Integer _ga_work[MAXDIM], _ga_lo[MAXDIM];
     COPYC2F(index, _ga_lo, ndim);
     wnga_access_block_grid_ptr(a,_ga_lo,ptr,_ga_work);
     COPYF2C(_ga_work,ld, ndim-1);
}